

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O3

void msd_CE1(uchar **strings,size_t n,size_t depth)

{
  uchar *puVar1;
  uchar *puVar2;
  int iVar3;
  size_t i_1;
  void *__ptr;
  void *__src;
  long lVar4;
  uchar **ppuVar5;
  long lVar6;
  uchar **ppuVar7;
  byte bVar8;
  byte bVar9;
  size_t i;
  size_t sVar10;
  size_t bucketsize [256];
  size_t bucketindex [256];
  size_t asStack_1040 [257];
  long local_838 [257];
  
  if (n < 0x20) {
    if (1 < n) {
      ppuVar5 = strings;
      do {
        puVar1 = ppuVar5[1];
        ppuVar5 = ppuVar5 + 1;
        for (ppuVar7 = ppuVar5; strings < ppuVar7; ppuVar7 = ppuVar7 + -1) {
          puVar2 = ppuVar7[-1];
          bVar8 = puVar2[depth];
          bVar9 = puVar1[depth];
          if ((bVar8 != 0) && (lVar4 = depth + 1, bVar8 == bVar9)) {
            do {
              bVar8 = puVar2[lVar4];
              bVar9 = puVar1[lVar4];
              if (bVar8 == 0) break;
              lVar4 = lVar4 + 1;
            } while (bVar8 == bVar9);
          }
          if (bVar8 <= bVar9) break;
          *ppuVar7 = puVar2;
        }
        iVar3 = (int)n;
        *ppuVar7 = puVar1;
        n = (size_t)(iVar3 - 1);
      } while (2 < iVar3);
    }
  }
  else {
    sVar10 = 0;
    asStack_1040[0] = 0x201fb2;
    memset(asStack_1040 + 1,0,0x800);
    asStack_1040[0] = 0x201fba;
    __ptr = malloc(n);
    do {
      bVar8 = strings[sVar10][depth];
      asStack_1040[(ulong)bVar8 + 1] = asStack_1040[(ulong)bVar8 + 1] + 1;
      *(byte *)((long)__ptr + sVar10) = bVar8;
      sVar10 = sVar10 + 1;
    } while (n != sVar10);
    asStack_1040[0] = 0x201fe5;
    __src = malloc(n * 8);
    local_838[0] = 0;
    lVar4 = 1;
    lVar6 = 0;
    do {
      lVar6 = lVar6 + asStack_1040[lVar4];
      local_838[lVar4] = lVar6;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
    sVar10 = 0;
    do {
      puVar1 = strings[sVar10];
      lVar4 = local_838[*(byte *)((long)__ptr + sVar10)];
      local_838[*(byte *)((long)__ptr + sVar10)] = lVar4 + 1;
      *(uchar **)((long)__src + lVar4 * 8) = puVar1;
      sVar10 = sVar10 + 1;
    } while (n != sVar10);
    asStack_1040[0] = 0x20204d;
    memcpy(strings,__src,n * 8);
    asStack_1040[0] = 0x202055;
    free(__src);
    asStack_1040[0] = 0x20205d;
    free(__ptr);
    lVar4 = 1;
    do {
      sVar10 = asStack_1040[lVar4 + 1];
      if (sVar10 != 0) {
        asStack_1040[0] = 0x202082;
        msd_CE1(strings + asStack_1040[1],sVar10,depth + 1);
        asStack_1040[1] = asStack_1040[1] + sVar10;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
  }
  return;
}

Assistant:

void
msd_CE1(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	size_t bucketsize[256] = {0};
	unsigned char* restrict oracle =
		(unsigned char*) malloc(n);
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i] = strings[i][depth]];
	unsigned char** restrict sorted = (unsigned char**)
		malloc(n*sizeof(unsigned char*));
	size_t bucketindex[256];
	bucketindex[0] = 0;
	for (size_t i=1; i < 256; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	free(sorted);
	free(oracle);
	size_t bsum = bucketsize[0];
	for (unsigned short i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_CE1(strings+bsum, bucketsize[i], depth+1);
		bsum += bucketsize[i];
	}
}